

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall MemoryBufferTest_Grow_Test::TestBody(MemoryBufferTest_Grow_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int *expected_expression;
  mock_allocator<int> *this_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i_1;
  AssertionResult gtest_ar_1;
  int mem [20];
  AssertionResult gtest_ar;
  int i;
  TestMemoryBuffer buffer;
  mock_allocator<int> alloc;
  Matcher<unsigned_long> *in_stack_fffffffffffffca8;
  mock_allocator<int> *in_stack_fffffffffffffcb0;
  Matcher<int_*> *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  char *in_stack_fffffffffffffcc8;
  int line;
  char *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  Type in_stack_fffffffffffffcdc;
  AssertHelper *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  type in_stack_fffffffffffffcec;
  Matcher<int_*> *in_stack_fffffffffffffcf0;
  Action<int_*(unsigned_long)> *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  type in_stack_fffffffffffffd34;
  AssertionResult local_278;
  char *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int value;
  AssertionResult local_218;
  int *local_208;
  undefined4 local_1bc;
  size_t local_178;
  undefined4 local_16c;
  AssertionResult local_168;
  int local_158;
  allocator_ref<mock_allocator<int>_> local_148;
  basic_buffer<int> local_140 [2];
  mock_allocator<int> local_f0;
  
  mock_allocator<int>::mock_allocator
            ((mock_allocator<int> *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  allocator_ref<mock_allocator<int>_>::allocator_ref(&local_148,&local_f0);
  TestBody::TestMemoryBuffer::TestMemoryBuffer
            ((TestMemoryBuffer *)in_stack_fffffffffffffcb0,(Allocator *)in_stack_fffffffffffffca8);
  fmt::v5::internal::basic_buffer<int>::resize
            ((basic_buffer<int> *)in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
  for (local_158 = 0; local_158 < 7; local_158 = local_158 + 1) {
    in_stack_fffffffffffffd30 = local_158 * local_158;
    in_stack_fffffffffffffd34 = fmt::v5::internal::to_unsigned<int>(local_158);
    in_stack_fffffffffffffd28 =
         (Action<int_*(unsigned_long)> *)
         fmt::v5::internal::basic_buffer<int>::operator[]
                   (local_140,(ulong)in_stack_fffffffffffffd34);
    *(int *)&(in_stack_fffffffffffffd28->impl_).value_ = in_stack_fffffffffffffd30;
  }
  local_16c = 10;
  local_178 = fmt::v5::internal::basic_buffer<int>::capacity(local_140);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            (in_stack_fffffffffffffcc8,
             (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             (uint *)in_stack_fffffffffffffcb8,(unsigned_long *)in_stack_fffffffffffffcb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffce0);
    testing::AssertionResult::failure_message((AssertionResult *)0x125b2c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd0,
               (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (Message *)in_stack_fffffffffffffd28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x125b89);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125be1);
  local_1bc = 0xdead;
  testing::Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)in_stack_fffffffffffffcf0,
             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  mock_allocator<int>::gmock_allocate(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  testing::internal::MockSpec<int_*(unsigned_long)>::InternalExpectedAt
            ((MockSpec<int_*(unsigned_long)> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (char *)in_stack_fffffffffffffdb8.ptr_,in_stack_fffffffffffffdb4,
             (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  local_208 = (int *)testing::Return<int*>((int *)in_stack_fffffffffffffca8);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<int_*> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  testing::internal::TypedExpectation<int_*(unsigned_long)>::WillOnce
            ((TypedExpectation<int_*(unsigned_long)> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
            );
  testing::Action<int_*(unsigned_long)>::~Action((Action<int_*(unsigned_long)> *)0x125ca0);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x125cad);
  TestBody::TestMemoryBuffer::grow
            ((TestMemoryBuffer *)in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
  fmt::v5::internal::basic_buffer<int>::capacity(local_140);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            (in_stack_fffffffffffffcc8,
             (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             (uint *)in_stack_fffffffffffffcb8,(unsigned_long *)in_stack_fffffffffffffcb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffce0);
    in_stack_fffffffffffffcf0 =
         (Matcher<int_*> *)testing::AssertionResult::failure_message((AssertionResult *)0x125dc0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd0,
               (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (Message *)in_stack_fffffffffffffd28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x125e1d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125e75);
  for (value = 0; value < 7; value = value + 1) {
    in_stack_fffffffffffffdac = value * value;
    in_stack_fffffffffffffcec = fmt::v5::internal::to_unsigned<int>(value);
    in_stack_fffffffffffffce0 =
         (AssertHelper *)
         fmt::v5::internal::basic_buffer<int>::operator[]
                   (local_140,(ulong)in_stack_fffffffffffffcec);
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffffcc8,
               (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
               (int *)in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffdb0);
    in_stack_fffffffffffffcdc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcdc);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffce0);
      in_stack_fffffffffffffcd0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x125f60);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd0,
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (Message *)in_stack_fffffffffffffd28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
      testing::Message::~Message((Message *)0x125fbd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x126012);
  }
  expected_expression = fmt::v5::internal::basic_buffer<int>::operator[](local_140,7);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)expected_expression,
             (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             (int *)in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
  line = (int)((ulong)expected_expression >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffce0);
    in_stack_fffffffffffffcb8 =
         (Matcher<int_*> *)testing::AssertionResult::failure_message((AssertionResult *)0x1260df);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd0,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffcc0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (Message *)in_stack_fffffffffffffd28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcb0);
    testing::Message::~Message((Message *)0x12613c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x126194);
  testing::Matcher<int_*>::Matcher
            (in_stack_fffffffffffffcf0,
             (int *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  testing::Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)in_stack_fffffffffffffcf0,
             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  this_00 = (mock_allocator<int> *)
            mock_allocator<int>::gmock_deallocate
                      ((mock_allocator<int> *)CONCAT17(uVar2,in_stack_fffffffffffffcc0),
                       in_stack_fffffffffffffcb8,(Matcher<unsigned_long> *)in_stack_fffffffffffffcb0
                      );
  testing::internal::MockSpec<void_(int_*,_unsigned_long)>::InternalExpectedAt
            ((MockSpec<void_(int_*,_unsigned_long)> *)CONCAT44(value,in_stack_fffffffffffffdc0),
             (char *)in_stack_fffffffffffffdb8.ptr_,in_stack_fffffffffffffdb4,
             (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x126216);
  testing::Matcher<int_*>::~Matcher((Matcher<int_*> *)0x126223);
  TestBody::TestMemoryBuffer::~TestMemoryBuffer((TestMemoryBuffer *)0x126230);
  mock_allocator<int>::~mock_allocator(this_00);
  return;
}

Assistant:

TEST(MemoryBufferTest, Grow) {
  typedef allocator_ref< mock_allocator<int> > Allocator;
  typedef basic_memory_buffer<int, 10, Allocator> Base;
  mock_allocator<int> alloc;
  struct TestMemoryBuffer : Base {
    TestMemoryBuffer(Allocator alloc) : Base(alloc) {}
    void grow(std::size_t size) { Base::grow(size); }
  } buffer((Allocator(&alloc)));
  buffer.resize(7);
  using fmt::internal::to_unsigned;
  for (int i = 0; i < 7; ++i)
    buffer[to_unsigned(i)] = i * i;
  EXPECT_EQ(10u, buffer.capacity());
  int mem[20];
  mem[7] = 0xdead;
  EXPECT_CALL(alloc, allocate(20)).WillOnce(Return(mem));
  buffer.grow(20);
  EXPECT_EQ(20u, buffer.capacity());
  // Check if size elements have been copied
  for (int i = 0; i < 7; ++i)
    EXPECT_EQ(i * i, buffer[to_unsigned(i)]);
  // and no more than that.
  EXPECT_EQ(0xdead, buffer[7]);
  EXPECT_CALL(alloc, deallocate(mem, 20));
}